

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

UInt32 Range_DecodeBit_7z(void *pp,UInt32 size0)

{
  uint uVar1;
  bool bVar2;
  undefined4 local_28;
  UInt32 symbol;
  UInt32 newBound;
  CPpmd7z_RangeDec *p;
  UInt32 size0_local;
  void *pp_local;
  
  uVar1 = (*(uint *)((long)pp + 0x18) >> 0xe) * size0;
  bVar2 = uVar1 <= *(uint *)((long)pp + 0x1c);
  if (bVar2) {
    *(uint *)((long)pp + 0x1c) = *(int *)((long)pp + 0x1c) - uVar1;
    *(uint *)((long)pp + 0x18) = *(int *)((long)pp + 0x18) - uVar1;
  }
  else {
    *(uint *)((long)pp + 0x18) = uVar1;
  }
  local_28 = (uint)bVar2;
  Range_Normalize((CPpmd7z_RangeDec *)pp);
  return local_28;
}

Assistant:

static UInt32 Range_DecodeBit_7z(void *pp, UInt32 size0)
{
  CPpmd7z_RangeDec *p = (CPpmd7z_RangeDec *)pp;
  UInt32 newBound = (p->Range >> 14) * size0;
  UInt32 symbol;
  if (p->Code < newBound)
  {
    symbol = 0;
    p->Range = newBound;
  }
  else
  {
    symbol = 1;
    p->Code -= newBound;
    p->Range -= newBound;
  }
  Range_Normalize(p);
  return symbol;
}